

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

string * __thiscall
vkt::tessellation::(anonymous_namespace)::Variable::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string		name								(void) const { return m_name; }